

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReplaceFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  char *pcVar2;
  JsonNode *pJVar3;
  ulong uVar4;
  JsonParse x;
  JsonParse local_68;
  
  if (0 < argc) {
    if ((argc & 1U) == 0) {
      jsonWrongNumArgs(ctx,"replace");
      return;
    }
    pcVar2 = (char *)sqlite3ValueText(*argv,'\x01');
    iVar1 = jsonParse(&local_68,ctx,pcVar2);
    if (iVar1 == 0) {
      if (argc != 1) {
        uVar4 = 1;
        do {
          pcVar2 = (char *)sqlite3ValueText(argv[uVar4],'\x01');
          pJVar3 = jsonLookup(&local_68,pcVar2,(int *)0x0,ctx);
          if (local_68.nErr != '\0') goto LAB_001ce759;
          if (pJVar3 != (JsonNode *)0x0) {
            pJVar3->jnFlags = pJVar3->jnFlags | 8;
            (pJVar3->u).iAppend = (int)uVar4 + 1;
          }
          uVar4 = uVar4 + 2;
        } while (uVar4 < (uint)argc);
      }
      if (((local_68.aNode)->jnFlags & 8) == 0) {
        jsonReturnJson(local_68.aNode,ctx,argv);
      }
      else {
        sqlite3VdbeMemCopy(ctx->pOut,argv[((local_68.aNode)->u).iAppend]);
      }
LAB_001ce759:
      sqlite3_free(local_68.aNode);
      local_68.nNode = 0;
      local_68.nAlloc = 0;
      local_68.aNode = (JsonNode *)0x0;
      sqlite3_free(local_68.aUp);
    }
  }
  return;
}

Assistant:

static void jsonReplaceFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, "replace");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto replace_err;
    if( pNode ){
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
replace_err:
  jsonParseReset(&x);
}